

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O1

int envy_bios_parse_xpio(envy_bios *bios,envy_bios_xpio *xpio,int idx)

{
  uint8_t *puVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  envy_bios_gpio_entry *peVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  char *__format;
  int iVar20;
  uint8_t bytes [5];
  undefined2 local_40;
  uint8_t uStack_3e;
  byte bStack_3d;
  byte local_3c;
  envy_bios_xpio *local_38;
  
  uVar3 = xpio->offset;
  if (uVar3 == 0) {
    return 0;
  }
  if ((uint)uVar3 < bios->length) {
    xpio->version = bios->data[(uint)uVar3];
    iVar16 = 0;
  }
  else {
    xpio->version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar16 = -0xe;
  }
  lVar15 = (ulong)xpio->offset + 1;
  if ((uint)lVar15 < bios->length) {
    xpio->hlen = bios->data[lVar15];
    iVar20 = 0;
  }
  else {
    xpio->hlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar20 = -0xe;
  }
  lVar15 = (ulong)xpio->offset + 2;
  if ((uint)lVar15 < bios->length) {
    xpio->entriesnum = bios->data[lVar15];
    iVar7 = 0;
  }
  else {
    xpio->entriesnum = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar7 = -0xe;
  }
  lVar15 = (ulong)xpio->offset + 3;
  puVar1 = &xpio->rlen;
  if ((uint)lVar15 < bios->length) {
    *puVar1 = bios->data[lVar15];
    iVar8 = 0;
  }
  else {
    *puVar1 = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar8 = -0xe;
  }
  lVar15 = (ulong)xpio->offset + 4;
  if ((uint)lVar15 < bios->length) {
    xpio->type = bios->data[lVar15];
    iVar9 = 0;
  }
  else {
    xpio->type = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar9 = -0xe;
  }
  lVar15 = (ulong)xpio->offset + 5;
  if ((uint)lVar15 < bios->length) {
    xpio->addr = bios->data[lVar15];
    iVar10 = 0;
  }
  else {
    xpio->addr = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar10 = -0xe;
  }
  lVar15 = (ulong)xpio->offset + 6;
  if ((uint)lVar15 < bios->length) {
    uVar19 = (ulong)bios->data[lVar15];
    iVar11 = 0;
  }
  else {
    uVar19 = 0;
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar11 = -0xe;
  }
  if ((((((iVar20 != 0 || iVar16 != 0) || iVar7 != 0) || iVar8 != 0) || iVar9 != 0) || iVar10 != 0)
      || iVar11 != 0) {
    return -0xe;
  }
  envy_bios_block(bios,(uint)xpio->offset,
                  (uint)xpio->entriesnum * (uint)xpio->rlen + (uint)xpio->hlen,"XPIO",idx);
  xpio->unk02_0 = (byte)uVar19 & 0xf;
  xpio->bus = (byte)(uVar19 >> 4) & 1;
  xpio->unk02_5 = (byte)uVar19 >> 5;
  if (xpio->version != (bios->gpio).xpiodir.version) {
    envy_bios_parse_xpio_cold_1();
  }
  uVar18 = 2;
  if (xpio->version != '0') {
    if (xpio->version != '@') {
      envy_bios_parse_xpio_cold_3();
      return -0x16;
    }
    uVar18 = 5;
    if (((bios->gpio).version != 'A') && (uVar18 = 4, *puVar1 == '\x02')) {
      envy_bios_parse_xpio_cold_2();
    }
  }
  bVar2 = xpio->hlen;
  if (bVar2 < 7) {
    __format = "XPIO table header too short [%d < %d]\n";
    uVar19 = 7;
  }
  else {
    if (uVar18 <= *puVar1) {
      if (bVar2 != 7) {
        fprintf(_stderr,"XPIO table header longer than expected [%d > %d]\n");
      }
      if (uVar18 < *puVar1) {
        fprintf(_stderr,"XPIO table record longer than expected [%d > %d]\n");
      }
      peVar13 = (envy_bios_gpio_entry *)calloc((ulong)xpio->entriesnum,0x12);
      xpio->entries = peVar13;
      if (peVar13 == (envy_bios_gpio_entry *)0x0) {
        return -0xc;
      }
      if (xpio->entriesnum != '\0') {
        uVar19 = 0;
        uVar18 = 0;
        local_38 = xpio;
        do {
          peVar13 = local_38->entries + uVar19;
          peVar13->offset =
               (ushort)local_38->rlen * (short)uVar19 + (ushort)local_38->hlen + local_38->offset;
          local_3c = 0;
          _local_40 = 0;
          uVar17 = 0;
          do {
            uVar12 = uVar18;
            if (*puVar1 <= uVar17) break;
            if ((int)uVar17 + (uint)peVar13->offset < bios->length) {
              *(uint8_t *)((long)&local_40 + uVar17) = bios->data[uVar17 + peVar13->offset];
              uVar14 = 0;
            }
            else {
              *(undefined1 *)((long)&local_40 + uVar17) = 0;
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
              uVar14 = 0xfffffff2;
            }
            uVar12 = 0;
            if ((uVar14 | uVar18) != 0) {
              bVar4 = false;
              uVar18 = uVar14 | uVar18;
              goto LAB_00259ca9;
            }
            uVar17 = uVar17 + 1;
            uVar18 = 0;
          } while (uVar17 != 5);
          bVar2 = (bios->gpio).version;
          bVar5 = (byte)local_40;
          bVar6 = local_40._1_1_;
          uVar18 = uVar12;
          if (bVar2 - 0x30 < 2) {
            if (1 < *puVar1) {
              peVar13->line = bVar5 & 0x1f;
              peVar13->tag = (byte)(local_40 >> 5) & 0x3f;
              peVar13->log[0] = bVar6 >> 3 & 3;
              peVar13->log[1] = bVar6 >> 5 & 3;
              peVar13->param = bVar6 >> 7;
              goto LAB_00259ca5;
            }
LAB_00259c46:
            bVar4 = false;
          }
          else {
            if (bVar2 == 0x40) {
              if (3 < *puVar1) {
                peVar13->line = (byte)local_40 & 0x1f;
                peVar13->unk40_0 = (byte)local_40 >> 5;
                peVar13->tag = local_40._1_1_;
                peVar13->unk40_2 = uStack_3e;
                peVar13->def = bStack_3d & 1;
                peVar13->mode = bStack_3d >> 1 & 3;
                peVar13->log[0] = bStack_3d >> 3 & 3;
                peVar13->log[1] = bStack_3d >> 5 & 3;
                peVar13->param = bStack_3d >> 7;
                goto LAB_00259ca5;
              }
              goto LAB_00259c46;
            }
            if (bVar2 != 0x41) {
              abort();
            }
            if (*puVar1 < 5) goto LAB_00259c46;
            peVar13->line = (byte)local_40 & 0x3f;
            peVar13->io = (byte)local_40 >> 6 & 1;
            peVar13->def = (byte)local_40 >> 7;
            peVar13->tag = local_40._1_1_;
            peVar13->spec_out = uStack_3e;
            peVar13->spec_in = bStack_3d & 0x1f;
            peVar13->gsync = bStack_3d >> 5 & 1;
            peVar13->reserved = bStack_3d >> 6 & 1;
            peVar13->param = bStack_3d >> 7;
            peVar13->lockpin = local_3c & 0xf;
            peVar13->log[0] = local_3c >> 4 & 3;
            peVar13->log[1] = local_3c >> 6;
LAB_00259ca5:
            bVar4 = true;
          }
LAB_00259ca9:
          if (!bVar4) {
            return -0xe;
          }
          uVar19 = uVar19 + 1;
          xpio = local_38;
        } while (uVar19 < local_38->entriesnum);
      }
      xpio->valid = '\x01';
      return 0;
    }
    __format = "XPIO table record too short [%d < %d]\n";
    uVar19 = (ulong)uVar18;
    bVar2 = *puVar1;
  }
  fprintf(_stderr,__format,(ulong)bVar2,uVar19);
  return -0x16;
}

Assistant:

int envy_bios_parse_xpio (struct envy_bios *bios, struct envy_bios_xpio *xpio, int idx) {
	if (!xpio->offset)
		return 0;
	int err = 0;
	uint8_t byte2;
	err |= bios_u8(bios, xpio->offset, &xpio->version);
	err |= bios_u8(bios, xpio->offset+1, &xpio->hlen);
	err |= bios_u8(bios, xpio->offset+2, &xpio->entriesnum);
	err |= bios_u8(bios, xpio->offset+3, &xpio->rlen);
	err |= bios_u8(bios, xpio->offset+4, &xpio->type);
	err |= bios_u8(bios, xpio->offset+5, &xpio->addr);
	err |= bios_u8(bios, xpio->offset+6, &byte2);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, xpio->offset, xpio->hlen + xpio->rlen * xpio->entriesnum, "XPIO", idx);
	xpio->unk02_0 = byte2 & 0xf;
	xpio->bus = byte2 >> 4 & 1;
	xpio->unk02_5 = byte2 >> 5;
	int wanthlen = 0;
	int wantrlen = 0;
	if (xpio->version != bios->gpio.xpiodir.version)
		ENVY_BIOS_WARN("XPIO version mismatch with XPIODIR\n");
	switch (xpio->version) {
		case 0x30:
			wanthlen = 7;
			wantrlen = 2;
			break;
		case 0x40:
			wanthlen = 7;
			wantrlen = 4;
			if (bios->gpio.version == 0x41)
				wantrlen = 5;
			else if (xpio->rlen == 2) {
				ENVY_BIOS_WARN("XPIO version 4.0 with 2-byte entries!\n");
				xpio->rlen = 4;
			}
			break;
		default:
			ENVY_BIOS_ERR("Unknown XPIO table version %d.%d\n", xpio->version >> 4, xpio->version & 0xf);
			return -EINVAL;
	}
	if (xpio->hlen < wanthlen) {
		ENVY_BIOS_ERR("XPIO table header too short [%d < %d]\n", xpio->hlen, wanthlen);
		return -EINVAL;
	}
	if (xpio->rlen < wantrlen) {
		ENVY_BIOS_ERR("XPIO table record too short [%d < %d]\n", xpio->rlen, wantrlen);
		return -EINVAL;
	}
	if (xpio->hlen > wanthlen) {
		ENVY_BIOS_WARN("XPIO table header longer than expected [%d > %d]\n", xpio->hlen, wanthlen);
	}
	if (xpio->rlen > wantrlen) {
		ENVY_BIOS_WARN("XPIO table record longer than expected [%d > %d]\n", xpio->rlen, wantrlen);
	}
	xpio->entries = calloc(xpio->entriesnum, sizeof *xpio->entries);
	if (!xpio->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < xpio->entriesnum; i++) {
		struct envy_bios_gpio_entry *entry = &xpio->entries[i];
		entry->offset = xpio->offset + xpio->hlen + xpio->rlen * i;
		/* note: structure is the same as GPIO, but tags are different, and some fields don't make sense */
		uint8_t bytes[5] = { 0 };
		int j;
		for (j = 0; j < 5 && j < xpio->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		uint16_t val;
		/* because someone forgot to bump XPIO version number on 4.1... */
		switch (bios->gpio.version) {
			case 0x30:
			case 0x31:
				if (xpio->rlen < 2)
					return -EFAULT;
				val = bytes[0] | bytes[1] << 8;
				entry->line = val & 0x1f;
				entry->tag = val >> 5 & 0x3f;
				entry->log[0] = val >> 11 & 3;
				entry->log[1] = val >> 13 & 3;
				entry->param = val >> 15 & 1;
				break;
			case 0x40:
				if (xpio->rlen < 4)
					return -EFAULT;
				entry->line = bytes[0] & 0x1f;
				entry->unk40_0 = bytes[0] >> 5 & 7;
				entry->tag = bytes[1];
				entry->unk40_2 = bytes[2];
				entry->def = bytes[3] & 1;
				entry->mode = bytes[3] >> 1 & 3;
				entry->log[0] = bytes[3] >> 3 & 3;
				entry->log[1] = bytes[3] >> 5 & 3;
				entry->param = bytes[3] >> 7 & 1;
				break;
			case 0x41:
				if (xpio->rlen < 5)
					return -EFAULT;
				entry->line = bytes[0] & 0x3f;
				entry->io = bytes[0] >> 6 & 1;
				entry->def = bytes[0] >> 7 & 1;
				entry->tag = bytes[1];
				entry->spec_out = bytes[2];
				entry->spec_in = bytes[3] & 0x1f;
				entry->gsync = bytes[3] >> 5 & 1;
				entry->reserved = bytes[3] >> 6 & 1;
				entry->param = bytes[3] >> 7 & 1;
				entry->lockpin = bytes[4] & 0xf;
				entry->log[0] = bytes[4] >> 4 & 3;
				entry->log[1] = bytes[4] >> 6 & 3;
				break;
			default:
				abort();
		}
	}
	xpio->valid = 1;
	return 0;
}